

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

float resolve_length(render_state_t *state,length_t *length,char mode)

{
  float fVar1;
  float local_20;
  float maximum;
  char mode_local;
  length_t *length_local;
  render_state_t *state_local;
  
  local_20 = 0.0;
  if (length->type == length_type_percent) {
    if (mode == 'x') {
      local_20 = state->view_width;
    }
    else if (mode == 'y') {
      local_20 = state->view_height;
    }
    else if (mode == 'o') {
      local_20 = hypotf(state->view_width,state->view_height);
      local_20 = local_20 / 1.4142135;
    }
  }
  fVar1 = convert_length(length,local_20);
  return fVar1;
}

Assistant:

static float resolve_length(const render_state_t* state, const length_t* length, char mode)
{
    float maximum = 0.f;
    if(length->type == length_type_percent) {
        if(mode == 'x') {
            maximum = state->view_width;
        } else if(mode == 'y') {
            maximum = state->view_height;
        } else if(mode == 'o') {
            maximum = hypotf(state->view_width, state->view_height) / PLUTOVG_SQRT2;
        }
    }

    return convert_length(length, maximum);
}